

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O0

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateOptionalArrayedF32Arr
          (BuiltInsValidator *this,Decoration *decoration,Instruction *inst,uint32_t num_components,
          function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *diag)

{
  Op OVar1;
  uint32_t id;
  Instruction *this_00;
  uint32_t subtype;
  spv_result_t error;
  uint32_t underlying_type;
  function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *diag_local;
  Instruction *pIStack_28;
  uint32_t num_components_local;
  Instruction *inst_local;
  Decoration *decoration_local;
  BuiltInsValidator *this_local;
  
  subtype = 0;
  _error = diag;
  diag_local._4_4_ = num_components;
  pIStack_28 = inst;
  inst_local = (Instruction *)decoration;
  decoration_local = (Decoration *)this;
  this_local._4_4_ = GetUnderlyingType(this->_,decoration,inst,&subtype);
  if (this_local._4_4_ == SPV_SUCCESS) {
    OVar1 = ValidationState_t::GetIdOpcode(this->_,subtype);
    if (OVar1 == OpTypeArray) {
      this_00 = ValidationState_t::FindDef(this->_,subtype);
      id = val::Instruction::word(this_00,2);
      OVar1 = ValidationState_t::GetIdOpcode(this->_,id);
      if (OVar1 == OpTypeArray) {
        subtype = id;
      }
    }
    this_local._4_4_ =
         ValidateF32ArrHelper
                   (this,(Decoration *)inst_local,pIStack_28,diag_local._4_4_,_error,subtype);
  }
  return this_local._4_4_;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateOptionalArrayedF32Arr(
    const Decoration& decoration, const Instruction& inst,
    uint32_t num_components,
    const std::function<spv_result_t(const std::string& message)>& diag) {
  uint32_t underlying_type = 0;
  if (spv_result_t error =
          GetUnderlyingType(_, decoration, inst, &underlying_type)) {
    return error;
  }

  // Strip an extra layer of arraying if present.
  if (_.GetIdOpcode(underlying_type) == spv::Op::OpTypeArray) {
    uint32_t subtype = _.FindDef(underlying_type)->word(2u);
    if (_.GetIdOpcode(subtype) == spv::Op::OpTypeArray) {
      underlying_type = subtype;
    }
  }

  return ValidateF32ArrHelper(decoration, inst, num_components, diag,
                              underlying_type);
}